

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void setup_var_ref(gen_ctx_t gen_ctx,MIR_reg_t var,MIR_insn_t insn,size_t nop,size_t insn_num,
                  int def_p)

{
  size_t sVar1;
  size_t sVar2;
  var_ref_t *pvVar3;
  size_t *psVar4;
  int def_p_local;
  size_t insn_num_local;
  size_t nop_local;
  MIR_insn_t insn_local;
  MIR_reg_t var_local;
  gen_ctx_t gen_ctx_local;
  
  if (var != 0xffffffff) {
    sVar1 = VARR_var_ref_tlength(gen_ctx->combine_ctx->var_refs);
    sVar2 = VARR_size_tlength(gen_ctx->combine_ctx->var_ref_ages);
    if (sVar1 != sVar2) {
      __assert_fail("(VARR_var_ref_tlength (gen_ctx->combine_ctx->var_refs)) == (VARR_size_tlength (gen_ctx->combine_ctx->var_ref_ages))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x22dc,
                    "void setup_var_ref(gen_ctx_t, MIR_reg_t, MIR_insn_t, size_t, size_t, int)");
    }
    sVar1 = VARR_var_ref_tlength(gen_ctx->combine_ctx->var_refs);
    if (sVar1 <= var) {
      do {
        VARR_size_tpush(gen_ctx->combine_ctx->var_ref_ages,0);
        VARR_var_ref_tpush(gen_ctx->combine_ctx->var_refs,
                           (var_ref_t)ZEXT1632(ZEXT816((MIR_insn_t)0x0)));
        sVar1 = VARR_var_ref_tlength(gen_ctx->combine_ctx->var_refs);
      } while (sVar1 <= var);
      pvVar3 = VARR_var_ref_taddr(gen_ctx->combine_ctx->var_refs);
      gen_ctx->combine_ctx->var_refs_addr = pvVar3;
      psVar4 = VARR_size_taddr(gen_ctx->combine_ctx->var_ref_ages);
      gen_ctx->combine_ctx->var_ref_ages_addr = psVar4;
    }
    gen_ctx->combine_ctx->var_ref_ages_addr[var] = gen_ctx->combine_ctx->curr_bb_var_ref_age;
    gen_ctx->combine_ctx->var_refs_addr[var].insn = insn;
    gen_ctx->combine_ctx->var_refs_addr[var].nop = nop;
    gen_ctx->combine_ctx->var_refs_addr[var].insn_num = insn_num;
    gen_ctx->combine_ctx->var_refs_addr[var].def_p = (char)def_p;
    gen_ctx->combine_ctx->var_refs_addr[var].del_p = '\0';
  }
  return;
}

Assistant:

static void setup_var_ref (gen_ctx_t gen_ctx, MIR_reg_t var, MIR_insn_t insn, size_t nop,
                           size_t insn_num, int def_p) {
  static const var_ref_t var_ref = {NULL, 0, 0, FALSE, FALSE};

  if (var == MIR_NON_VAR) return;
  gen_assert (VARR_LENGTH (var_ref_t, var_refs) == VARR_LENGTH (size_t, var_ref_ages));
  if (VARR_LENGTH (var_ref_t, var_refs) <= var) {
    do {
      VARR_PUSH (size_t, var_ref_ages, 0);
      VARR_PUSH (var_ref_t, var_refs, var_ref);
    } while (VARR_LENGTH (var_ref_t, var_refs) <= var);
    var_refs_addr = VARR_ADDR (var_ref_t, var_refs);
    var_ref_ages_addr = VARR_ADDR (size_t, var_ref_ages);
  }
  var_ref_ages_addr[var] = curr_bb_var_ref_age;
  var_refs_addr[var].insn = insn;
  var_refs_addr[var].nop = nop;
  var_refs_addr[var].insn_num = insn_num;
  var_refs_addr[var].def_p = def_p;
  var_refs_addr[var].del_p = FALSE;
}